

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok.c
# Opt level: O3

XML_Convert_Result
unknown_toUtf16(ENCODING *enc,char **fromP,char *fromLim,unsigned_short **toP,unsigned_short *toLim)

{
  unsigned_short *puVar1;
  unsigned_short uVar2;
  unsigned_short *puVar4;
  byte *pbVar5;
  int iVar3;
  
  pbVar5 = (byte *)*fromP;
  if (pbVar5 < fromLim) {
    puVar4 = *toP;
    do {
      if (toLim <= puVar4) {
        if (puVar4 != toLim) {
          return XML_CONVERT_COMPLETED;
        }
        return XML_CONVERT_OUTPUT_EXHAUSTED;
      }
      uVar2 = *(unsigned_short *)((long)enc[3].literalScanners + (ulong)*pbVar5 * 2 + 0x40);
      if (uVar2 == 0) {
        iVar3 = (*enc[3].charRefNumber)((ENCODING *)enc[3].predefinedEntityName,(char *)pbVar5);
        uVar2 = (unsigned_short)iVar3;
        pbVar5 = (byte *)(*fromP + ((ulong)*(byte *)((long)enc[1].scanners + (ulong)(byte)**fromP) -
                                   3));
      }
      else {
        pbVar5 = pbVar5 + 1;
      }
      *fromP = (char *)pbVar5;
      puVar1 = *toP;
      puVar4 = puVar1 + 1;
      *toP = puVar4;
      *puVar1 = uVar2;
      pbVar5 = (byte *)*fromP;
    } while (pbVar5 < fromLim);
  }
  return XML_CONVERT_COMPLETED;
}

Assistant:

static enum XML_Convert_Result PTRCALL
unknown_toUtf16(const ENCODING *enc, const char **fromP, const char *fromLim,
                unsigned short **toP, const unsigned short *toLim) {
  const struct unknown_encoding *uenc = AS_UNKNOWN_ENCODING(enc);
  while (*fromP < fromLim && *toP < toLim) {
    unsigned short c = uenc->utf16[(unsigned char)**fromP];
    if (c == 0) {
      c = (unsigned short)uenc->convert(uenc->userData, *fromP);
      *fromP += (AS_NORMAL_ENCODING(enc)->type[(unsigned char)**fromP]
                 - (BT_LEAD2 - 2));
    } else
      (*fromP)++;
    *(*toP)++ = c;
  }

  if ((*toP == toLim) && (*fromP < fromLim))
    return XML_CONVERT_OUTPUT_EXHAUSTED;
  else
    return XML_CONVERT_COMPLETED;
}